

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O2

bool crnlib::image_utils::has_alpha(image_u8 *img)

{
  uint uVar1;
  uint uVar2;
  uint y;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar2 = 0;
  for (uVar3 = 0; uVar5 = (ulong)img->m_width, uVar1 = uVar2, uVar3 != img->m_height;
      uVar3 = uVar3 + 1) {
    while( true ) {
      uVar4 = (ulong)uVar1;
      if (uVar5 == 0) break;
      uVar5 = uVar5 - 1;
      uVar1 = uVar1 + 1;
      if (img->m_pPixels[uVar4].field_0.field_0.a != 0xff) goto LAB_00115f44;
    }
    uVar2 = uVar2 + img->m_pitch;
  }
LAB_00115f44:
  return uVar3 < img->m_height;
}

Assistant:

bool has_alpha(const image_u8& img)
        {
            for (uint y = 0; y < img.get_height(); y++)
            {
                for (uint x = 0; x < img.get_width(); x++)
                {
                    if (img(x, y).a < 255)
                    {
                        return true;
                    }
                }
            }

            return false;
        }